

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pool.hpp
# Opt level: O3

void __thiscall iutest::detail::iuPool::~iuPool(iuPool *this)

{
  pointer __src;
  iuIObject *piVar1;
  pointer ppiVar2;
  pointer __dest;
  
  __dest = (this->m_pool).
           super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppiVar2 = (this->m_pool).
            super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest != ppiVar2) {
    __src = __dest + 1;
    do {
      piVar1 = *__dest;
      if (__src != ppiVar2) {
        memmove(__dest,__src,(long)ppiVar2 - (long)__src);
        ppiVar2 = (this->m_pool).
                  super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppiVar2 = ppiVar2 + -1;
      (this->m_pool).
      super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppiVar2;
      if (piVar1 != (iuIObject *)0x0) {
        (*piVar1->_vptr_iuIObject[1])(piVar1);
        ppiVar2 = (this->m_pool).
                  super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    } while (__dest != ppiVar2);
    __dest = (this->m_pool).
             super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (__dest != (pointer)0x0) {
    operator_delete(__dest,(long)(this->m_pool).
                                 super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__dest);
    return;
  }
  return;
}

Assistant:

~iuPool()
    {
        // すべて解放する
        for( pool::iterator it=m_pool.begin(); it != m_pool.end(); )
        {
            value_ptr p = *it;
            it = m_pool.erase(it);
            delete p;
        }
    }